

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_lexer.c
# Opt level: O1

Token update_state(IncludeState *s,int eoi,uchar *cur,uchar *tok,Token val)

{
  if (eoi == 0) {
    s->bytes_left = s->bytes_left + (*(int *)&s->source - (int)cur);
    s->source = (char *)cur;
  }
  else {
    s->bytes_left = 0;
    s->source = s->source_base + s->orig_length;
    if (tok < &_end && (uchar *)((long)&ctx + 7U) < tok) {
      s->token = s->source_base + s->orig_length;
      goto LAB_00134085;
    }
  }
  s->token = (char *)tok;
LAB_00134085:
  s->tokenlen = *(int *)&s->source - *(int *)&s->token;
  s->tokenval = val;
  return val;
}

Assistant:

static Token update_state(IncludeState *s, int eoi, const uchar *cur,
                          const uchar *tok, const Token val)
{
    if (eoi)
    {
        s->bytes_left = 0;
        s->source = (const char *) s->source_base + s->orig_length;
        if ( (tok >= sentinel) && (tok < (sentinel+YYMAXFILL)) )
            s->token = s->source;
        else
            s->token = (const char *) tok;
    } // if
    else
    {
        s->bytes_left -= (unsigned int) (cur - ((const uchar *) s->source));
        s->source = (const char *) cur;
        s->token = (const char *) tok;
    } // else
    s->tokenlen = (unsigned int) (s->source - s->token);
    s->tokenval = val;
    return val;
}